

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preferences.cpp
# Opt level: O3

IPreferences * f8n::prefs::Preferences::Unmanaged(string *name)

{
  Preferences *this;
  undefined1 local_40 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_20;
  
  if (name->_M_string_length == 0) {
    this = (Preferences *)operator_new(0x68);
    Preferences(this,name,ModeTransient);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_40 + 0x10),"unmanaged_",name);
    ForPlugin((Preferences *)local_40,
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_40 + 0x10)
             );
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_);
    }
    this = (Preferences *)local_40._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._16_8_ != &local_20) {
      operator_delete((void *)local_40._16_8_,(ulong)(local_20._M_allocated_capacity + 1));
    }
  }
  return &this->super_IPreferences;
}

Assistant:

f8n::sdk::IPreferences* Preferences::Unmanaged(const std::string& name) {
    if (!name.size()) {
        return new Preferences(name, ModeTransient);
    }

    return Preferences::ForPlugin("unmanaged_" + name).get();
}